

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O3

void jsons_print_typedefs(lyout *out,lys_tpdf *tpdf,uint8_t tpdf_size,int *first)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  long lVar2;
  
  if ((int)CONCAT71(in_register_00000011,tpdf_size) != 0) {
    ly_print(out,"%s\"typedefs\":[",",");
    lVar2 = 0;
    do {
      pcVar1 = ",";
      if (lVar2 == 0) {
        pcVar1 = "";
      }
      ly_print(out,"%s\"%s\"",pcVar1,*(undefined8 *)(tpdf->padding + lVar2 + -0x1d));
      lVar2 = lVar2 + 0x80;
    } while ((ulong)tpdf_size << 7 != lVar2);
    ly_print(out,"]");
    return;
  }
  return;
}

Assistant:

static void
jsons_print_typedefs(struct lyout *out, const struct lys_tpdf *tpdf, uint8_t tpdf_size, int *first)
{
    int i;

    if (!tpdf_size) {
        return;
    }

    ly_print(out, "%s\"typedefs\":[", (first && (*first)) ? "" : ",");
    for (i = 0; i < tpdf_size; ++i) {
        ly_print(out, "%s\"%s\"", i ? "," : "", tpdf[i].name);
    }
    ly_print(out, "]");
    if (first) {
        (*first) = 0;
    }
}